

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_fromEntries(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  JSValue this_obj;
  JSValue JVar9;
  JSValue method;
  JSValue this_obj_00;
  JSValue JVar10;
  BOOL done;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff6c;
  BOOL *in_stack_ffffffffffffff70;
  BOOL *pBStack_80;
  uint local_78;
  JSValueUnion local_70;
  int local_54;
  JSValue local_50;
  JSValueUnion local_40;
  ulong local_38;
  
  JVar9 = *argv;
  this_obj = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  JVar3 = this_obj.u;
  if ((uint)this_obj.tag == 6) {
LAB_00163934:
    uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
  }
  else {
    JVar9 = JS_GetIterator(ctx,JVar9,0);
    uVar7 = (uint)JVar9.tag;
    uVar5 = JVar9.tag & 0xffffffff;
    uVar8 = uVar7;
    if (uVar5 == 6) {
      method = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      uVar11 = 0;
      method = JS_GetPropertyInternal(ctx,JVar9,0x6a,JVar9,0);
      pBStack_80 = in_stack_ffffffffffffff70;
      if ((int)method.tag != 6) {
        do {
          local_38 = uVar5;
          this_obj_00 = JS_IteratorNext(ctx,JVar9,method,(int)&local_54,
                                        (JSValue *)CONCAT44(in_stack_ffffffffffffff6c,uVar11),
                                        pBStack_80);
          JVar4 = this_obj_00.u;
          uVar8 = (uint)this_obj_00.tag;
          uVar6 = 2;
          if ((this_obj_00.tag & 0xffffffffU) != 6) {
            if (local_54 == 0) {
              if (uVar8 == 0xffffffff) {
                JVar10 = JS_GetPropertyValue(ctx,this_obj_00,(JSValue)ZEXT816(0));
                if ((int)JVar10.tag != 6) {
                  local_50 = JVar10;
                  JVar10 = JS_GetPropertyValue(ctx,this_obj_00,(JSValue)ZEXT816(1));
                  if ((int)JVar10.tag == 6) {
                    JS_FreeValue(ctx,local_50);
                  }
                  else {
                    pBStack_80 = (BOOL *)JVar10.tag;
                    uVar11 = JVar10.u._0_4_;
                    in_stack_ffffffffffffff6c = JVar10.u._4_4_;
                    iVar2 = JS_DefinePropertyValueValue(ctx,this_obj,local_50,JVar10,0x4007);
                    if (-1 < iVar2) {
                      JS_FreeValue(ctx,this_obj_00);
                      uVar6 = 0;
                      goto LAB_00163b18;
                    }
                  }
                }
              }
              else {
                JS_ThrowTypeError(ctx,"not an object");
              }
              local_40 = JVar4;
              if ((0xfffffff4 < uVar8) &&
                 (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,this_obj_00);
              }
            }
            else {
              if ((0xfffffff4 < uVar8) &&
                 (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,this_obj_00);
              }
              uVar6 = 3;
            }
          }
LAB_00163b18:
          iVar2 = (int)uVar6;
          uVar5 = local_38;
        } while (iVar2 == 0);
        if (iVar2 == 1) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar6;
          this_obj = (JSValue)(auVar1 << 0x40);
          uVar5 = 0;
          goto LAB_00163bf0;
        }
        if (iVar2 != 2) {
          JS_FreeValue(ctx,method);
          JS_FreeValue(ctx,JVar9);
          goto LAB_00163934;
        }
        uVar8 = (uint)local_38;
      }
    }
    local_70 = method.u;
    if (uVar8 == 0xffffffff) {
      JS_IteratorClose(ctx,JVar9,1);
    }
    local_78 = (uint)method.tag;
    if ((0xfffffff4 < local_78) &&
       (iVar2 = *local_70.ptr, *(int *)local_70.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,method);
    }
    if ((0xfffffff4 < uVar7) && (iVar2 = *JVar9.u.ptr, *(int *)JVar9.u.ptr = iVar2 + -1, iVar2 < 2))
    {
      __JS_FreeValueRT(ctx->rt,JVar9);
    }
    if ((0xfffffff4 < (uint)this_obj.tag) &&
       (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,this_obj);
    }
    this_obj = (JSValue)(ZEXT816(6) << 0x40);
    uVar5 = 0;
  }
LAB_00163bf0:
  JVar9.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar5);
  JVar9.tag = this_obj.tag;
  return JVar9;
}

Assistant:

static JSValue js_object_fromEntries(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue obj, iter, next_method = JS_UNDEFINED;
    JSValueConst iterable;
    BOOL done;

    /*  RequireObjectCoercible() not necessary because it is tested in
        JS_GetIterator() by JS_GetProperty() */
    iterable = argv[0];

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return obj;
    
    iter = JS_GetIterator(ctx, iterable, FALSE);
    if (JS_IsException(iter))
        goto fail;
    next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
    if (JS_IsException(next_method))
        goto fail;
    
    for(;;) {
        JSValue key, value, item;
        item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
        if (JS_IsException(item))
            goto fail;
        if (done) {
            JS_FreeValue(ctx, item);
            break;
        }
        
        key = JS_UNDEFINED;
        value = JS_UNDEFINED;
        if (!JS_IsObject(item)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            goto fail1;
        }
        key = JS_GetPropertyUint32(ctx, item, 0);
        if (JS_IsException(key))
            goto fail1;
        value = JS_GetPropertyUint32(ctx, item, 1);
        if (JS_IsException(value)) {
            JS_FreeValue(ctx, key);
            goto fail1;
        }
        if (JS_DefinePropertyValueValue(ctx, obj, key, value,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0) {
        fail1:
            JS_FreeValue(ctx, item);
            goto fail;
        }
        JS_FreeValue(ctx, item);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}